

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

void sysbvm_dwarf_cfi_beginFDE(sysbvm_dwarf_cfi_builder_t *cfi,size_t pc)

{
  size_t sVar1;
  int32_t pcRelativeValue;
  undefined8 local_30;
  
  local_30 = local_30 & 0xffffffff00000000;
  sVar1 = (cfi->buffer).size;
  sysbvm_dynarray_addAll(&cfi->buffer,4,&local_30);
  cfi->fdeOffset = sVar1;
  sVar1 = (cfi->buffer).size;
  local_30._0_4_ = (int)sVar1 - (int)cfi->cieOffset;
  sysbvm_dynarray_addAll(&cfi->buffer,4,&local_30);
  cfi->fdeContentOffset = sVar1;
  cfi->fdeInitialPC = pc;
  if (cfi->isEhFrame == true) {
    local_30._0_4_ = 0;
    sVar1 = (cfi->buffer).size;
    sysbvm_dynarray_addAll(&cfi->buffer,4,&local_30);
    cfi->fdeInitialLocationOffset = sVar1;
    local_30 = (ulong)local_30._4_4_ << 0x20;
    sVar1 = (cfi->buffer).size;
    sysbvm_dynarray_addAll(&cfi->buffer,4,&local_30);
    cfi->fdeAddressingRangeOffset = sVar1;
    local_30 = local_30 & 0xffffffffffffff00;
    sysbvm_dynarray_add(&cfi->buffer,&local_30);
  }
  else {
    local_30 = 0;
    sVar1 = (cfi->buffer).size;
    sysbvm_dynarray_addAll(&cfi->buffer,8,&local_30);
    cfi->fdeInitialLocationOffset = sVar1;
    local_30 = 0;
    sVar1 = (cfi->buffer).size;
    sysbvm_dynarray_addAll(&cfi->buffer,8,&local_30);
    cfi->fdeAddressingRangeOffset = sVar1;
  }
  cfi->currentPC = cfi->fdeInitialPC;
  cfi->stackFrameSize = cfi->initialStackFrameSize;
  cfi->framePointerRegister = 0;
  cfi->hasFramePointerRegister = false;
  cfi->isInPrologue = true;
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_cfi_beginFDE(sysbvm_dwarf_cfi_builder_t *cfi, size_t pc)
{
    cfi->fdeOffset = sysbvm_dwarf_encodeDWord(&cfi->buffer, 0);
    cfi->fdeContentOffset = sysbvm_dwarf_encodeDwarfPointerPCRelative(&cfi->buffer, (uint32_t)cfi->cieOffset);
    cfi->fdeInitialPC = pc;
    if(cfi->isEhFrame)
    {
        cfi->fdeInitialLocationOffset = sysbvm_dwarf_encodeDWord(&cfi->buffer, 0);
        cfi->fdeAddressingRangeOffset = sysbvm_dwarf_encodeDWord(&cfi->buffer, 0);
        sysbvm_dwarf_encodeULEB128(&cfi->buffer, 0);
    }
    else
    {
        cfi->fdeInitialLocationOffset = sysbvm_dwarf_encodePointer(&cfi->buffer, 0);
        cfi->fdeAddressingRangeOffset = sysbvm_dwarf_encodePointer(&cfi->buffer, 0);
    }
    cfi->currentPC = cfi->fdeInitialPC;
    cfi->stackFrameSize = cfi->initialStackFrameSize;
    cfi->framePointerRegister = 0;
    cfi->hasFramePointerRegister = false;
    cfi->isInPrologue = true;
}